

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  xmlNodePtr pxVar1;
  int iVar2;
  _xmlNode **pp_Var3;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    pp_Var3 = &doc->children;
    while ((pxVar1 = *pp_Var3, pxVar1 != (xmlNodePtr)0x0 && (pxVar1->type != XML_ELEMENT_NODE))) {
      pp_Var3 = &pxVar1->next;
    }
    if (pxVar1 == root) {
      return pxVar1;
    }
    xmlUnlinkNodeInternal(root);
    iVar2 = xmlSetTreeDoc(root,doc);
    if (-1 < iVar2) {
      root->parent = (_xmlNode *)doc;
      if (pxVar1 != (xmlNodePtr)0x0) {
        xmlReplaceNode(pxVar1,root);
        return pxVar1;
      }
      pxVar1 = doc->children;
      if (pxVar1 == (xmlNodePtr)0x0) {
        doc->children = root;
        doc->last = root;
      }
      else {
        xmlAddSibling(pxVar1,root);
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == root)
        return(old);
    xmlUnlinkNodeInternal(root);
    if (xmlSetTreeDoc(root, doc) < 0)
        return(NULL);
    root->parent = (xmlNodePtr) doc;
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}